

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t tree_current_is_symblic_link_target(tree *t)

{
  bool local_11;
  tree *t_local;
  
  tree_current_is_symblic_link_target::lst = tree_current_lstat(t);
  tree_current_is_symblic_link_target::st = tree_current_stat(t);
  local_11 = false;
  if (((tree_current_is_symblic_link_target::st != (stat_conflict *)0x0) &&
      (local_11 = false, tree_current_is_symblic_link_target::lst != (stat_conflict *)0x0)) &&
     (local_11 = false,
     tree_current_is_symblic_link_target::st->st_dev == t->current_filesystem->dev)) {
    local_11 = tree_current_is_symblic_link_target::st->st_dev !=
               tree_current_is_symblic_link_target::lst->st_dev;
  }
  return (wchar_t)local_11;
}

Assistant:

static int
tree_current_is_symblic_link_target(struct tree *t)
{
	static const struct stat *lst, *st;

	lst = tree_current_lstat(t);
	st = tree_current_stat(t);
	return (st != NULL && lst != NULL &&
	    (int64_t)st->st_dev == t->current_filesystem->dev &&
	    st->st_dev != lst->st_dev);
}